

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

_Bool imap_matchresp(char *line,size_t len,char *cmd)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t max;
  char *pcVar4;
  size_t cmd_len;
  char *end;
  char *cmd_local;
  size_t len_local;
  char *line_local;
  
  pcVar3 = line + len;
  max = strlen(cmd);
  len_local = (size_t)(line + 2);
  if (((len_local < pcVar3) && ('/' < *(char *)len_local)) &&
     (pcVar4 = (char *)len_local, *(char *)len_local < ':')) {
    do {
      len_local = (size_t)pcVar4;
      pcVar4 = (char *)(len_local + 1);
      bVar1 = false;
      if ((pcVar4 < pcVar3) && (bVar1 = false, '/' < *pcVar4)) {
        bVar1 = *pcVar4 < ':';
      }
    } while (bVar1);
    if ((pcVar4 == pcVar3) || (*pcVar4 != ' ')) {
      return false;
    }
    len_local = len_local + 2;
  }
  if (((pcVar3 < (char *)(len_local + max)) ||
      (iVar2 = curl_strnequal((char *)len_local,cmd,max), iVar2 == 0)) ||
     ((*(char *)(len_local + max) != ' ' && ((char *)(len_local + max + 2) != pcVar3)))) {
    line_local._7_1_ = false;
  }
  else {
    line_local._7_1_ = true;
  }
  return line_local._7_1_;
}

Assistant:

static bool imap_matchresp(const char *line, size_t len, const char *cmd)
{
  const char *end = line + len;
  size_t cmd_len = strlen(cmd);

  /* Skip the untagged response marker */
  line += 2;

  /* Do we have a number after the marker? */
  if(line < end && ISDIGIT(*line)) {
    /* Skip the number */
    do
      line++;
    while(line < end && ISDIGIT(*line));

    /* Do we have the space character? */
    if(line == end || *line != ' ')
      return FALSE;

    line++;
  }

  /* Does the command name match and is it followed by a space character or at
     the end of line? */
  if(line + cmd_len <= end && strncasecompare(line, cmd, cmd_len) &&
     (line[cmd_len] == ' ' || line + cmd_len + 2 == end))
    return TRUE;

  return FALSE;
}